

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Console.cpp
# Opt level: O3

void __thiscall Console::Prompt::Private::redirectPendingData(Private *this)

{
  uint uVar1;
  code *pcVar2;
  int iVar3;
  uint uVar4;
  size_t sVar5;
  size_t sVar6;
  int iVar7;
  int iVar8;
  timeval tv;
  fd_set fdr;
  char buffer [4096];
  timeval local_10c8;
  fd_set local_10b8;
  undefined1 local_1038 [4104];
  
  while( true ) {
    local_10b8.fds_bits[0xe] = 0;
    local_10b8.fds_bits[0xf] = 0;
    local_10b8.fds_bits[0xc] = 0;
    local_10b8.fds_bits[0xd] = 0;
    local_10b8.fds_bits[10] = 0;
    local_10b8.fds_bits[0xb] = 0;
    local_10b8.fds_bits[8] = 0;
    local_10b8.fds_bits[9] = 0;
    local_10b8.fds_bits[6] = 0;
    local_10b8.fds_bits[7] = 0;
    local_10b8.fds_bits[4] = 0;
    local_10b8.fds_bits[5] = 0;
    local_10b8.fds_bits[2] = 0;
    local_10b8.fds_bits[3] = 0;
    local_10b8.fds_bits[0] = 0;
    local_10b8.fds_bits[1] = 0;
    iVar3 = this->stdoutRead;
    iVar7 = iVar3 + 0x3f;
    if (-1 < iVar3) {
      iVar7 = iVar3;
    }
    local_10b8.fds_bits[iVar7 >> 6] = local_10b8.fds_bits[iVar7 >> 6] | 1L << ((byte)iVar3 & 0x3f);
    iVar7 = this->stderrRead;
    iVar8 = iVar7 + 0x3f;
    if (-1 < iVar7) {
      iVar8 = iVar7;
    }
    local_10b8.fds_bits[iVar8 >> 6] = local_10b8.fds_bits[iVar8 >> 6] | 1L << ((byte)iVar7 & 0x3f);
    local_10c8.tv_sec = 0;
    local_10c8.tv_usec = 0;
    if (iVar7 < iVar3) {
      iVar7 = iVar3;
    }
    iVar3 = select(iVar7 + 1,&local_10b8,(fd_set *)0x0,(fd_set *)0x0,&local_10c8);
    if (iVar3 == 0) {
      return;
    }
    if (iVar3 == -1) break;
    uVar1 = this->stdoutRead;
    uVar4 = uVar1 + 0x3f;
    if (-1 < (int)uVar1) {
      uVar4 = uVar1;
    }
    if ((((ulong)local_10b8.fds_bits[(int)uVar4 >> 6] >> ((ulong)uVar1 & 0x3f) & 1) != 0) &&
       (((sVar5 = read(uVar1,local_1038,0x1000), sVar5 == 0xffffffffffffffff &&
         (iVar3 = Debug::printf("%s:%u: verification failed: %s\n",
                                "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/Console.cpp"
                                ,0x35c,"i != -1"), iVar3 != 0)) ||
        ((sVar6 = write(originalStdout,local_1038,sVar5), sVar6 != sVar5 &&
         (iVar3 = Debug::printf("%s:%u: verification failed: %s\n",
                                "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/Console.cpp"
                                ,0x35d,"write(originalStdout, buffer, i) == i"), iVar3 != 0))))))
    goto LAB_001055dd;
    uVar1 = this->stderrRead;
    uVar4 = uVar1 + 0x3f;
    if (-1 < (int)uVar1) {
      uVar4 = uVar1;
    }
    if ((((ulong)local_10b8.fds_bits[(int)uVar4 >> 6] >> ((ulong)uVar1 & 0x3f) & 1) != 0) &&
       (((sVar5 = read(uVar1,local_1038,0x1000), sVar5 == 0xffffffffffffffff &&
         (iVar3 = Debug::printf("%s:%u: verification failed: %s\n",
                                "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/Console.cpp"
                                ,0x363,"i != -1"), iVar3 != 0)) ||
        ((sVar6 = write(this->originalStderr,local_1038,sVar5), sVar6 != sVar5 &&
         (iVar3 = Debug::printf("%s:%u: verification failed: %s\n",
                                "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/Console.cpp"
                                ,0x364,"write(originalStderr, buffer, i) == i"), iVar3 != 0))))))
    goto LAB_001055dd;
  }
  iVar3 = Debug::printf("%s:%u: assertion failed: %s\n",
                        "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/Console.cpp"
                        ,0x353,"false");
  if (iVar3 == 0) {
    return;
  }
LAB_001055dd:
  pcVar2 = (code *)invalidInstructionException();
  (*pcVar2)();
}

Assistant:

void redirectPendingData()
  {
#ifdef _MSC_VER
    DWORD read;
    while(GetOverlappedResult(hStdOutRead, &outOverlapped, &read, FALSE))
    {
        DWORD written;
        VERIFY(WriteConsole(hOriginalStdOut, stdoutBuffer, read / sizeof(char), &written, NULL));
        ASSERT(written == read / sizeof(char));
        while(ReadFile(hStdOutRead, stdoutBuffer, sizeof(stdoutBuffer), &read, &outOverlapped))
        {
          VERIFY(WriteConsole(hOriginalStdOut, stdoutBuffer, read / sizeof(char), &written, NULL));
          ASSERT(written == read / sizeof(char));
        }
    }
    while(GetOverlappedResult(hStdErrRead, &errOverlapped, &read, FALSE))
    {
        DWORD written;
        VERIFY(WriteConsole(hOriginalStdErr, stderrBuffer, read / sizeof(char), &written, NULL));
        ASSERT(written == read / sizeof(char));
        while(ReadFile(hStdErrRead, stderrBuffer, sizeof(stderrBuffer), &read, &errOverlapped))
        {
          VERIFY(WriteConsole(hOriginalStdErr, stderrBuffer, read / sizeof(char), &written, NULL));
          ASSERT(written == read / sizeof(char));
        }
    }
#else
    for(;;)
    {
      fd_set fdr;
      FD_ZERO(&fdr);
      FD_SET(stdoutRead, &fdr);
      FD_SET(stderrRead, &fdr);
      timeval tv = {0, 0};
      switch(select((stdoutRead > stderrRead ? stdoutRead : stderrRead) + 1, &fdr, 0, 0, &tv))
      {
      case -1:
        ASSERT(false);
        return;
      case 0:
        break;
      default: // todo: redirect data character by character to ensure utf8 and escaped sequences are valid?
        if(FD_ISSET(stdoutRead, &fdr))
        {
          char buffer[4096];
          ssize i = read(stdoutRead, buffer, sizeof(buffer));
          VERIFY(i != -1);
          VERIFY(write(originalStdout, buffer, i) == i);
        }
        if(FD_ISSET(stderrRead, &fdr))
        {
          char buffer[4096];
          ssize i = read(stderrRead, buffer, sizeof(buffer));
          VERIFY(i != -1);
          VERIFY(write(originalStderr, buffer, i) == i);
        }
        continue;
      }
      break;
    }
#endif
  }